

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprs.cpp
# Opt level: O2

CTcSymProp * __thiscall
CTcParser::def_special_prop(CTcParser *this,int def,char *name,tc_prop_id *idp)

{
  tctarg_prop_id_t prop;
  CTcPrsSymtab *this_00;
  CTcSymProp *this_01;
  size_t sVar1;
  undefined4 in_register_00000034;
  char *siz;
  
  if (def == 0) {
    this_00 = this->global_symtab_;
    sVar1 = strlen(name);
    siz = name;
    this_01 = (CTcSymProp *)CTcPrsSymtab::find(this_00,name,sVar1);
    if ((this_01 == (CTcSymProp *)0x0) ||
       (*(int *)&(this_01->super_CTcSymPropBase).super_CTcSymbol.super_CTcSymbolBase.
                 super_CVmHashEntryCS.super_CVmHashEntry.field_0x24 != 3)) {
      this_01 = (CTcSymProp *)CTcSymbolBase::operator_new((CTcSymbolBase *)0x30,(size_t)siz);
      sVar1 = strlen(name);
      CTcSymProp::CTcSymProp(this_01,name,sVar1,0,0);
    }
  }
  else {
    prop = G_cg->next_prop_;
    G_cg->next_prop_ = prop + 1;
    this_01 = (CTcSymProp *)
              CTcSymbolBase::operator_new((CTcSymbolBase *)0x30,CONCAT44(in_register_00000034,def));
    sVar1 = strlen(name);
    CTcSymProp::CTcSymProp(this_01,name,sVar1,0,prop);
    (*(this_01->super_CTcSymPropBase).super_CTcSymbol.super_CTcSymbolBase.super_CVmHashEntryCS.
      super_CVmHashEntry._vptr_CVmHashEntry[0xf])(this_01);
    (*this->global_symtab_->_vptr_CTcPrsSymtab[3])(this->global_symtab_,this_01);
  }
  if (idp != (tc_prop_id *)0x0) {
    *idp = (uint)(this_01->super_CTcSymPropBase).prop_;
  }
  return this_01;
}

Assistant:

CTcSymProp *CTcParser::def_special_prop(int def, const char *name,
                                        tc_prop_id *idp)
{
    /* we haven't created or found the property yet */
    CTcSymProp *propsym = 0;
    
    /* define or look up the property, as required */
    if (def)
    {
        /* allocate the ID */
        tctarg_prop_id_t id = G_cg->new_prop_id();

        /* create the symbol */
        propsym = new CTcSymProp(name, strlen(name), FALSE, id);
        
        /* mark it as referenced, since the compiler itself uses it */
        propsym->mark_referenced();

        /* add it to the global symbol table */
        global_symtab_->add_entry(propsym);
    }
    else
    {
        /* find the entry */
        CTcSymbol *sym = global_symtab_->find(name, strlen(name));

        /* check to see if we found a property symbol */
        if (sym != 0 && sym->get_type() == TC_SYM_PROP)
        {
            /* got it - use the definition we found */
            propsym = (CTcSymProp *)sym;
        }
        else
        {
            /* not found - create a dummy symbol for it */
            propsym = new CTcSymProp(name, strlen(name), FALSE,
                                     TCTARG_INVALID_PROP);
        }
    }

    /* hand the property ID back to the caller if they want it */
    if (idp != 0)
        *idp = (propsym != 0 ? propsym->get_prop() : TCTARG_INVALID_PROP);

    /* return the symbol */
    return propsym;
}